

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  size_t __n;
  long lVar21;
  uint uVar22;
  size_t len;
  char *pcVar23;
  int iVar24;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  ulong uVar25;
  size_t sVar26;
  char *__format;
  __m128i *in_R9;
  int32_t t;
  uint uVar27;
  ulong uVar28;
  undefined8 unaff_R15;
  ulong uVar29;
  bool bVar30;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined1 auVar35 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined1 auVar59 [16];
  __m128i alVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ushort uVar70;
  undefined1 auVar63 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i alVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar78;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar79 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ushort uVar92;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  undefined1 auVar93 [16];
  ushort uVar100;
  undefined1 auVar101 [16];
  ushort uVar102;
  undefined1 auVar103 [16];
  short sVar104;
  ushort uVar105;
  short sVar111;
  short sVar113;
  short sVar115;
  short sVar117;
  short sVar119;
  short sVar121;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  ushort uVar112;
  ushort uVar114;
  ushort uVar116;
  ushort uVar118;
  ushort uVar120;
  ushort uVar122;
  short sVar123;
  ushort uVar124;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  int32_t in_stack_fffffffffffffd68;
  uint local_290;
  ulong local_260;
  int local_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  ushort local_1a8;
  ushort uStack_1a6;
  undefined1 local_198 [16];
  ushort local_188;
  ushort uStack_186;
  ushort uStack_184;
  ushort uStack_182;
  ushort uStack_180;
  ushort uStack_17e;
  ushort uStack_17c;
  ushort uStack_17a;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  ushort local_128;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  short local_c8;
  short sStack_c6;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  short sVar31;
  short sVar32;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar23 = "profile->matrix";
      }
      else {
        local_260 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar23 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar5 = (profile->profile16).matches;
            pvVar6 = (profile->profile16).similar;
            iVar19 = ppVar4->min;
            iVar24 = -iVar19;
            if (iVar19 != -open && SBORROW4(iVar19,-open) == iVar19 + open < 0) {
              iVar24 = open;
            }
            iVar19 = ppVar4->max;
            ppVar20 = parasail_result_new_table3((uint)(local_260 + 7) & 0x7ffffff8,s2Len);
            if (ppVar20 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar25 = local_260 + 7 >> 3;
            ppVar20->flag = ppVar20->flag | 0x8230404;
            b = parasail_memalign___m128i(0x10,uVar25);
            b_00 = parasail_memalign___m128i(0x10,uVar25);
            b_01 = parasail_memalign___m128i(0x10,uVar25);
            b_02 = parasail_memalign___m128i(0x10,uVar25);
            b_03 = parasail_memalign___m128i(0x10,uVar25);
            b_04 = parasail_memalign___m128i(0x10,uVar25);
            b_05 = parasail_memalign___m128i(0x10,uVar25);
            b_06 = parasail_memalign___m128i(0x10,uVar25);
            ptr = parasail_memalign___m128i(0x10,uVar25);
            ptr_00 = parasail_memalign___m128i(0x10,uVar25);
            ptr_01 = parasail_memalign___m128i(0x10,uVar25);
            ptr_02 = parasail_memalign___m128i(0x10,uVar25);
            ptr_03 = parasail_memalign___m128i(0x10,uVar25);
            ptr_04 = parasail_memalign___m128i(0x10,uVar25);
            auVar35._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar35._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar71._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar71._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar35 = packssdw(auVar35,auVar71);
            auVar59._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar59._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar72._0_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar72._8_8_ = -(ulong)(b_06 == (__m128i *)0x0);
            auVar71 = packssdw(auVar59,auVar72);
            auVar35 = packssdw(auVar35,auVar71);
            if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar35 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar35 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar35 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar35 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar35 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar35 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar35 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar35 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar35 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar35[0xf] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_04 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar35 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar33 = auVar35._0_4_;
            auVar35 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar34 = auVar35._0_4_;
            local_290 = iVar24 - 0x7fff;
            auVar35 = pshuflw(ZEXT416(local_290),ZEXT416(local_290),0);
            auVar71 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),0x7ffe - (short)iVar19
                                            ));
            auVar71 = pshuflw(auVar71,auVar71,0);
            local_c8 = auVar71._0_2_;
            sStack_c6 = auVar71._2_2_;
            uVar27 = (uint)uVar25;
            auVar59 = pshufb(ZEXT416(uVar27),_DAT_008a3bd0);
            uVar17 = local_290 & 0xffff;
            len = (size_t)-(gap * uVar27);
            auVar72 = pshufb(ZEXT416(-(gap * uVar27)),_DAT_008a3bd0);
            auVar72 = paddsw(auVar72,ZEXT416(uVar17));
            alVar60[1] = extraout_RDX;
            alVar60[0] = uVar25;
            parasail_memset___m128i(b_03,alVar60,len);
            alVar36[1] = extraout_RDX_00;
            alVar36[0] = uVar25;
            parasail_memset___m128i(b_04,alVar36,len);
            alVar73[1] = extraout_RDX_01;
            alVar73[0] = uVar25;
            parasail_memset___m128i(b_05,alVar73,len);
            c[1] = extraout_RDX_02;
            c[0] = uVar25;
            parasail_memset___m128i(b_06,c,len);
            c_00[1] = extraout_RDX_03;
            c_00[0] = uVar25;
            parasail_memset___m128i(b,c_00,len);
            c_01[1] = extraout_RDX_04;
            c_01[0] = uVar25;
            parasail_memset___m128i(b_00,c_01,len);
            c_02[1] = extraout_RDX_05;
            c_02[0] = uVar25;
            parasail_memset___m128i(b_01,c_02,len);
            c_03[1] = extraout_RDX_06;
            c_03[0] = uVar25;
            parasail_memset___m128i(b_02,c_03,len);
            auVar79._4_4_ = uVar33;
            auVar79._0_4_ = uVar33;
            auVar79._8_4_ = uVar33;
            auVar79._12_4_ = uVar33;
            alVar73 = (__m128i)psubsw((undefined1  [16])0x0,auVar79);
            uVar18 = uVar27 - 1;
            alVar36 = (__m128i)pmovsxbw(extraout_XMM0,0x101010101010101);
            alVar60 = alVar36;
            for (uVar22 = uVar18; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
              ptr_03[uVar22] = alVar73;
              ptr_04[uVar22] = alVar60;
              auVar101._4_4_ = uVar34;
              auVar101._0_4_ = uVar34;
              auVar101._8_4_ = uVar34;
              auVar101._12_4_ = uVar34;
              alVar73 = (__m128i)psubsw((undefined1  [16])alVar73,auVar101);
              alVar60 = (__m128i)paddsw((undefined1  [16])alVar60,(undefined1  [16])alVar36);
            }
            __n = uVar25 << 4;
            local_138 = CONCAT26(sStack_c6,CONCAT24(local_c8,auVar71._0_4_));
            uStack_130 = CONCAT26(sStack_c6,CONCAT24(local_c8,auVar71._0_4_));
            local_1a8 = auVar35._0_2_;
            uStack_1a6 = auVar35._2_2_;
            local_128 = local_1a8;
            uStack_126 = uStack_1a6;
            uStack_124 = local_1a8;
            uStack_122 = uStack_1a6;
            uStack_120 = local_1a8;
            uStack_11e = uStack_1a6;
            uStack_11c = local_1a8;
            uStack_11a = uStack_1a6;
            local_b8 = auVar35._0_4_;
            local_24c = 0;
            local_188 = local_1a8;
            uStack_186 = uStack_1a6;
            uStack_184 = local_1a8;
            uStack_182 = uStack_1a6;
            uStack_180 = local_1a8;
            uStack_17e = uStack_1a6;
            uStack_17c = local_1a8;
            uStack_17a = uStack_1a6;
            uStack_b4 = local_b8;
            uStack_b0 = local_b8;
            uStack_ac = local_b8;
            for (uVar29 = 0; uVar29 != (uint)s2Len; uVar29 = uVar29 + 1) {
              uVar28 = b_03[uVar18][0];
              uVar12 = b_04[uVar18][0];
              uVar13 = b_05[uVar18][0];
              uVar14 = b_06[uVar18][0];
              auVar61._0_8_ = uVar28 << 0x10;
              auVar61._8_8_ = b_03[uVar18][1] << 0x10 | uVar28 >> 0x30;
              auVar89._0_8_ = uVar12 << 0x10;
              auVar89._8_8_ = b_04[uVar18][1] << 0x10 | uVar12 >> 0x30;
              auVar91._0_8_ = uVar13 << 0x10;
              auVar91._8_8_ = b_05[uVar18][1] << 0x10 | uVar13 >> 0x30;
              auVar93._0_8_ = uVar14 << 0x10;
              auVar93._8_8_ = b_06[uVar18][1] << 0x10 | uVar14 >> 0x30;
              lVar21 = (long)(int)(ppVar4->mapper[(byte)s2[uVar29]] * uVar27) * 0x10;
              local_228 = ZEXT816(0);
              auVar106 = (undefined1  [16])0x0;
              local_248 = ZEXT816(0);
              local_238 = ZEXT816(0);
              uVar78 = local_1a8;
              uVar80 = uStack_1a6;
              uVar81 = local_1a8;
              uVar82 = uStack_1a6;
              uVar83 = local_1a8;
              uVar84 = uStack_1a6;
              uVar85 = local_1a8;
              uVar86 = uStack_1a6;
              for (sVar26 = 0; __n != sVar26; sVar26 = sVar26 + 0x10) {
                auVar35 = *(undefined1 (*) [16])((long)*b_03 + sVar26);
                auVar71 = *(undefined1 (*) [16])((long)*b_04 + sVar26);
                auVar79 = *(undefined1 (*) [16])((long)*b_05 + sVar26);
                auVar107._4_4_ = uVar33;
                auVar107._0_4_ = uVar33;
                auVar107._8_4_ = uVar33;
                auVar107._12_4_ = uVar33;
                auVar101 = psubsw(auVar35,auVar107);
                auVar87._4_4_ = uVar34;
                auVar87._0_4_ = uVar34;
                auVar87._8_4_ = uVar34;
                auVar87._12_4_ = uVar34;
                auVar107 = psubsw(*(undefined1 (*) [16])((long)*b + sVar26),auVar87);
                sVar31 = auVar101._0_2_;
                sVar104 = auVar107._0_2_;
                auVar37._0_2_ = -(ushort)(sVar104 < sVar31);
                sVar45 = auVar101._2_2_;
                sVar111 = auVar107._2_2_;
                auVar37._2_2_ = -(ushort)(sVar111 < sVar45);
                sVar47 = auVar101._4_2_;
                sVar113 = auVar107._4_2_;
                auVar37._4_2_ = -(ushort)(sVar113 < sVar47);
                sVar49 = auVar101._6_2_;
                sVar115 = auVar107._6_2_;
                auVar37._6_2_ = -(ushort)(sVar115 < sVar49);
                sVar51 = auVar101._8_2_;
                sVar117 = auVar107._8_2_;
                auVar37._8_2_ = -(ushort)(sVar117 < sVar51);
                sVar53 = auVar101._10_2_;
                sVar119 = auVar107._10_2_;
                auVar37._10_2_ = -(ushort)(sVar119 < sVar53);
                sVar55 = auVar101._12_2_;
                sVar121 = auVar107._12_2_;
                sVar57 = auVar101._14_2_;
                auVar37._12_2_ = -(ushort)(sVar121 < sVar55);
                sVar123 = auVar107._14_2_;
                auVar37._14_2_ = -(ushort)(sVar123 < sVar57);
                auVar125 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + sVar26),auVar71,auVar37);
                auVar126 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + sVar26),auVar79,auVar37);
                auVar101 = *(undefined1 (*) [16])((long)*b_06 + sVar26);
                auVar107 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + sVar26),auVar101,auVar37);
                auVar106 = paddsw(auVar106,*(undefined1 (*) [16])((long)*ptr_03 + sVar26));
                sVar32 = auVar106._0_2_;
                auVar38._0_2_ = -(ushort)((short)uVar78 < sVar32);
                sVar46 = auVar106._2_2_;
                auVar38._2_2_ = -(ushort)((short)uVar80 < sVar46);
                sVar48 = auVar106._4_2_;
                auVar38._4_2_ = -(ushort)((short)uVar81 < sVar48);
                sVar50 = auVar106._6_2_;
                auVar38._6_2_ = -(ushort)((short)uVar82 < sVar50);
                sVar52 = auVar106._8_2_;
                auVar38._8_2_ = -(ushort)((short)uVar83 < sVar52);
                sVar54 = auVar106._10_2_;
                auVar38._10_2_ = -(ushort)((short)uVar84 < sVar54);
                sVar56 = auVar106._12_2_;
                sVar58 = auVar106._14_2_;
                auVar38._12_2_ = -(ushort)((short)uVar85 < sVar56);
                auVar38._14_2_ = -(ushort)((short)uVar86 < sVar58);
                local_228 = pblendvb(local_228,local_158,auVar38);
                local_248 = pblendvb(local_248,local_168,auVar38);
                uVar105 = (ushort)(sVar104 < sVar31) * sVar31 |
                          (ushort)(sVar104 >= sVar31) * sVar104;
                uVar112 = (ushort)(sVar111 < sVar45) * sVar45 |
                          (ushort)(sVar111 >= sVar45) * sVar111;
                uVar114 = (ushort)(sVar113 < sVar47) * sVar47 |
                          (ushort)(sVar113 >= sVar47) * sVar113;
                uVar116 = (ushort)(sVar115 < sVar49) * sVar49 |
                          (ushort)(sVar115 >= sVar49) * sVar115;
                uVar118 = (ushort)(sVar117 < sVar51) * sVar51 |
                          (ushort)(sVar117 >= sVar51) * sVar117;
                uVar120 = (ushort)(sVar119 < sVar53) * sVar53 |
                          (ushort)(sVar119 >= sVar53) * sVar119;
                uVar122 = (ushort)(sVar121 < sVar55) * sVar55 |
                          (ushort)(sVar121 >= sVar55) * sVar121;
                uVar124 = (ushort)(sVar123 < sVar57) * sVar57 |
                          (ushort)(sVar123 >= sVar57) * sVar123;
                auVar106 = paddsw(local_178,*(undefined1 (*) [16])((long)*ptr_04 + sVar26));
                local_238 = pblendvb(local_238,auVar106,auVar38);
                auVar87 = paddsw(auVar61,*(undefined1 (*) [16])((long)pvVar3 + sVar26 + lVar21));
                auVar89 = paddsw(auVar89,*(undefined1 (*) [16])((long)pvVar5 + sVar26 + lVar21));
                auVar91 = paddsw(auVar91,*(undefined1 (*) [16])((long)pvVar6 + sVar26 + lVar21));
                sVar31 = auVar87._0_2_;
                auVar39._0_2_ = -(ushort)(sVar31 < (short)uVar105);
                sVar45 = auVar87._2_2_;
                auVar39._2_2_ = -(ushort)(sVar45 < (short)uVar112);
                sVar47 = auVar87._4_2_;
                auVar39._4_2_ = -(ushort)(sVar47 < (short)uVar114);
                sVar49 = auVar87._6_2_;
                auVar39._6_2_ = -(ushort)(sVar49 < (short)uVar116);
                sVar51 = auVar87._8_2_;
                auVar39._8_2_ = -(ushort)(sVar51 < (short)uVar118);
                sVar53 = auVar87._10_2_;
                auVar39._10_2_ = -(ushort)(sVar53 < (short)uVar120);
                sVar55 = auVar87._12_2_;
                auVar39._12_2_ = -(ushort)(sVar55 < (short)uVar122);
                sVar57 = auVar87._14_2_;
                auVar39._14_2_ = -(ushort)(sVar57 < (short)uVar124);
                local_158 = pblendvb(auVar89,auVar125,auVar39);
                local_168 = pblendvb(auVar91,auVar126,auVar39);
                auVar106 = pmovsxbw(local_168,0x101010101010101);
                auVar61 = paddsw(auVar107,auVar106);
                auVar93 = paddsw(auVar93,auVar106);
                local_178 = pblendvb(auVar93,auVar61,auVar39);
                uVar78 = (ushort)((short)uVar78 < sVar32) * sVar32 |
                         ((short)uVar78 >= sVar32) * uVar78;
                uVar80 = (ushort)((short)uVar80 < sVar46) * sVar46 |
                         ((short)uVar80 >= sVar46) * uVar80;
                uVar81 = (ushort)((short)uVar81 < sVar48) * sVar48 |
                         ((short)uVar81 >= sVar48) * uVar81;
                uVar82 = (ushort)((short)uVar82 < sVar50) * sVar50 |
                         ((short)uVar82 >= sVar50) * uVar82;
                uVar83 = (ushort)((short)uVar83 < sVar52) * sVar52 |
                         ((short)uVar83 >= sVar52) * uVar83;
                uVar84 = (ushort)((short)uVar84 < sVar54) * sVar54 |
                         ((short)uVar84 >= sVar54) * uVar84;
                uVar85 = (ushort)((short)uVar85 < sVar56) * sVar56 |
                         ((short)uVar85 >= sVar56) * uVar85;
                uVar86 = (ushort)((short)uVar86 < sVar58) * sVar58 |
                         ((short)uVar86 >= sVar58) * uVar86;
                puVar1 = (ushort *)((long)*b + sVar26);
                *puVar1 = uVar105;
                puVar1[1] = uVar112;
                puVar1[2] = uVar114;
                puVar1[3] = uVar116;
                puVar1[4] = uVar118;
                puVar1[5] = uVar120;
                puVar1[6] = uVar122;
                puVar1[7] = uVar124;
                *(undefined1 (*) [16])((long)*b_00 + sVar26) = auVar125;
                *(undefined1 (*) [16])((long)*b_01 + sVar26) = auVar126;
                *(undefined1 (*) [16])((long)*b_02 + sVar26) = auVar61;
                auVar106._0_2_ =
                     (ushort)((short)uVar105 < sVar31) * sVar31 |
                     ((short)uVar105 >= sVar31) * uVar105;
                auVar106._2_2_ =
                     (ushort)((short)uVar112 < sVar45) * sVar45 |
                     ((short)uVar112 >= sVar45) * uVar112;
                auVar106._4_2_ =
                     (ushort)((short)uVar114 < sVar47) * sVar47 |
                     ((short)uVar114 >= sVar47) * uVar114;
                auVar106._6_2_ =
                     (ushort)((short)uVar116 < sVar49) * sVar49 |
                     ((short)uVar116 >= sVar49) * uVar116;
                auVar106._8_2_ =
                     (ushort)((short)uVar118 < sVar51) * sVar51 |
                     ((short)uVar118 >= sVar51) * uVar118;
                auVar106._10_2_ =
                     (ushort)((short)uVar120 < sVar53) * sVar53 |
                     ((short)uVar120 >= sVar53) * uVar120;
                auVar106._12_2_ =
                     (ushort)((short)uVar122 < sVar55) * sVar55 |
                     ((short)uVar122 >= sVar55) * uVar122;
                auVar106._14_2_ =
                     (ushort)((short)uVar124 < sVar57) * sVar57 |
                     ((short)uVar124 >= sVar57) * uVar124;
                *(undefined1 (*) [16])((long)*b_03 + sVar26) = auVar87;
                *(undefined1 (*) [16])((long)*b_04 + sVar26) = auVar89;
                *(undefined1 (*) [16])((long)*b_05 + sVar26) = auVar91;
                *(undefined1 (*) [16])((long)*b_06 + sVar26) = auVar93;
                in_R9 = b_05;
                auVar61 = auVar35;
                auVar89 = auVar71;
                auVar91 = auVar79;
                auVar93 = auVar101;
              }
              auVar108._0_8_ = auVar106._0_8_ << 0x10;
              auVar108._8_8_ = auVar106._8_8_ << 0x10 | auVar106._0_8_ >> 0x30;
              auVar126._0_8_ = local_158._0_8_ << 0x10;
              auVar126._8_8_ = local_158._8_8_ << 0x10 | (ulong)local_158._0_8_ >> 0x30;
              auVar74._0_8_ = local_168._0_8_ << 0x10;
              auVar74._8_8_ = local_168._8_8_ << 0x10 | (ulong)local_168._0_8_ >> 0x30;
              auVar90._0_8_ = local_178._0_8_ << 0x10;
              auVar90._8_8_ = local_178._8_8_ << 0x10 | (ulong)local_178._0_8_ >> 0x30;
              auVar35 = paddsw((undefined1  [16])*ptr_03,auVar108);
              sVar31 = auVar35._0_2_;
              auVar125._0_2_ = -(ushort)(sVar31 < (short)uVar78);
              sVar32 = auVar35._2_2_;
              auVar125._2_2_ = -(ushort)(sVar32 < (short)uVar80);
              sVar45 = auVar35._4_2_;
              auVar125._4_2_ = -(ushort)(sVar45 < (short)uVar81);
              sVar46 = auVar35._6_2_;
              auVar125._6_2_ = -(ushort)(sVar46 < (short)uVar82);
              sVar47 = auVar35._8_2_;
              auVar125._8_2_ = -(ushort)(sVar47 < (short)uVar83);
              sVar48 = auVar35._10_2_;
              auVar125._10_2_ = -(ushort)(sVar48 < (short)uVar84);
              sVar49 = auVar35._12_2_;
              auVar125._12_2_ = -(ushort)(sVar49 < (short)uVar85);
              sVar50 = auVar35._14_2_;
              auVar125._14_2_ = -(ushort)(sVar50 < (short)uVar86);
              auVar88._0_2_ =
                   (sVar31 < (short)uVar78) * uVar78 | (ushort)(sVar31 >= (short)uVar78) * sVar31;
              auVar88._2_2_ =
                   (sVar32 < (short)uVar80) * uVar80 | (ushort)(sVar32 >= (short)uVar80) * sVar32;
              auVar88._4_2_ =
                   (sVar45 < (short)uVar81) * uVar81 | (ushort)(sVar45 >= (short)uVar81) * sVar45;
              auVar88._6_2_ =
                   (sVar46 < (short)uVar82) * uVar82 | (ushort)(sVar46 >= (short)uVar82) * sVar46;
              auVar88._8_2_ =
                   (sVar47 < (short)uVar83) * uVar83 | (ushort)(sVar47 >= (short)uVar83) * sVar47;
              auVar88._10_2_ =
                   (sVar48 < (short)uVar84) * uVar84 | (ushort)(sVar48 >= (short)uVar84) * sVar48;
              auVar88._12_2_ =
                   (sVar49 < (short)uVar85) * uVar85 | (ushort)(sVar49 >= (short)uVar85) * sVar49;
              auVar88._14_2_ =
                   (sVar50 < (short)uVar86) * uVar86 | (ushort)(sVar50 >= (short)uVar86) * sVar50;
              auVar35 = pblendvb(auVar126,local_228,auVar125);
              auVar79 = pblendvb(auVar74,local_248,auVar125);
              auVar71 = paddsw((undefined1  [16])*ptr_04,auVar90);
              auVar71 = pblendvb(auVar71,local_238,auVar125);
              iVar19 = 6;
              while( true ) {
                auVar75._0_8_ = auVar88._0_8_ << 0x10;
                auVar75._8_8_ = auVar88._8_8_ << 0x10 | auVar88._0_8_ >> 0x30;
                local_198._0_8_ = auVar35._0_8_ << 0x10;
                local_198._8_8_ = auVar35._8_8_ << 0x10 | auVar35._0_8_ >> 0x30;
                local_98._0_8_ = auVar79._0_8_ << 0x10;
                local_98._8_8_ = auVar79._8_8_ << 0x10 | auVar79._0_8_ >> 0x30;
                local_a8._0_8_ = auVar71._0_8_ << 0x10;
                local_a8._8_8_ = auVar71._8_8_ << 0x10 | auVar71._0_8_ >> 0x30;
                bVar30 = iVar19 == 0;
                iVar19 = iVar19 + -1;
                if (bVar30) break;
                auVar101 = paddsw(auVar75,auVar72);
                sVar31 = auVar88._0_2_;
                sVar51 = auVar101._0_2_;
                auVar40._0_2_ = -(ushort)(sVar51 < sVar31);
                sVar32 = auVar88._2_2_;
                sVar52 = auVar101._2_2_;
                auVar40._2_2_ = -(ushort)(sVar52 < sVar32);
                sVar45 = auVar88._4_2_;
                sVar53 = auVar101._4_2_;
                auVar40._4_2_ = -(ushort)(sVar53 < sVar45);
                sVar46 = auVar88._6_2_;
                sVar54 = auVar101._6_2_;
                auVar40._6_2_ = -(ushort)(sVar54 < sVar46);
                sVar47 = auVar88._8_2_;
                sVar55 = auVar101._8_2_;
                auVar40._8_2_ = -(ushort)(sVar55 < sVar47);
                sVar48 = auVar88._10_2_;
                sVar56 = auVar101._10_2_;
                auVar40._10_2_ = -(ushort)(sVar56 < sVar48);
                sVar49 = auVar88._12_2_;
                sVar57 = auVar101._12_2_;
                sVar50 = auVar88._14_2_;
                auVar40._12_2_ = -(ushort)(sVar57 < sVar49);
                sVar58 = auVar101._14_2_;
                auVar40._14_2_ = -(ushort)(sVar58 < sVar50);
                auVar35 = pblendvb(local_198,auVar35,auVar40);
                auVar79 = pblendvb(local_98,auVar79,auVar40);
                auVar101 = paddsw(local_a8,auVar59);
                auVar71 = pblendvb(auVar101,auVar71,auVar40);
                auVar88._0_2_ =
                     (ushort)(sVar31 < sVar51) * sVar51 | (ushort)(sVar31 >= sVar51) * sVar31;
                auVar88._2_2_ =
                     (ushort)(sVar32 < sVar52) * sVar52 | (ushort)(sVar32 >= sVar52) * sVar32;
                auVar88._4_2_ =
                     (ushort)(sVar45 < sVar53) * sVar53 | (ushort)(sVar45 >= sVar53) * sVar45;
                auVar88._6_2_ =
                     (ushort)(sVar46 < sVar54) * sVar54 | (ushort)(sVar46 >= sVar54) * sVar46;
                auVar88._8_2_ =
                     (ushort)(sVar47 < sVar55) * sVar55 | (ushort)(sVar47 >= sVar55) * sVar47;
                auVar88._10_2_ =
                     (ushort)(sVar48 < sVar56) * sVar56 | (ushort)(sVar48 >= sVar56) * sVar48;
                auVar88._12_2_ =
                     (ushort)(sVar49 < sVar57) * sVar57 | (ushort)(sVar49 >= sVar57) * sVar49;
                auVar88._14_2_ =
                     (ushort)(sVar50 < sVar58) * sVar58 | (ushort)(sVar50 >= sVar58) * sVar50;
              }
              auVar76 = paddsw(auVar75,ZEXT416(uVar17));
              sVar31 = auVar76._0_2_;
              auVar41._0_2_ = -(ushort)(0 < sVar31);
              sVar32 = auVar76._2_2_;
              sVar51 = auVar106._0_2_;
              auVar41._2_2_ = -(ushort)(sVar51 < sVar32);
              sVar45 = auVar76._4_2_;
              sVar52 = auVar106._2_2_;
              auVar41._4_2_ = -(ushort)(sVar52 < sVar45);
              sVar46 = auVar76._6_2_;
              sVar53 = auVar106._4_2_;
              auVar41._6_2_ = -(ushort)(sVar53 < sVar46);
              sVar47 = auVar76._8_2_;
              sVar54 = auVar106._6_2_;
              auVar41._8_2_ = -(ushort)(sVar54 < sVar47);
              sVar48 = auVar76._10_2_;
              sVar55 = auVar106._8_2_;
              auVar41._10_2_ = -(ushort)(sVar55 < sVar48);
              sVar49 = auVar76._12_2_;
              sVar56 = auVar106._10_2_;
              sVar50 = auVar76._14_2_;
              auVar41._12_2_ = -(ushort)(sVar56 < sVar49);
              sVar57 = auVar106._12_2_;
              auVar41._14_2_ = -(ushort)(sVar57 < sVar50);
              auVar109._2_2_ =
                   (ushort)(sVar51 < sVar32) * sVar32 | (ushort)(sVar51 >= sVar32) * sVar51;
              auVar109._0_2_ = (ushort)(0 < sVar31) * sVar31;
              auVar109._4_2_ =
                   (ushort)(sVar52 < sVar45) * sVar45 | (ushort)(sVar52 >= sVar45) * sVar52;
              auVar109._6_2_ =
                   (ushort)(sVar53 < sVar46) * sVar46 | (ushort)(sVar53 >= sVar46) * sVar53;
              auVar109._8_2_ =
                   (ushort)(sVar54 < sVar47) * sVar47 | (ushort)(sVar54 >= sVar47) * sVar54;
              auVar109._10_2_ =
                   (ushort)(sVar55 < sVar48) * sVar48 | (ushort)(sVar55 >= sVar48) * sVar55;
              auVar109._12_2_ =
                   (ushort)(sVar56 < sVar49) * sVar49 | (ushort)(sVar56 >= sVar49) * sVar56;
              auVar109._14_2_ =
                   (ushort)(sVar57 < sVar50) * sVar50 | (ushort)(sVar57 >= sVar50) * sVar57;
              local_238 = pblendvb(auVar126,local_198,auVar41);
              local_248 = pblendvb(auVar74,local_98,auVar41);
              local_228 = pblendvb(auVar90,local_a8,auVar41);
              lVar21 = 0;
              for (uVar28 = 0; t = (int32_t)uVar29, uVar25 != uVar28; uVar28 = uVar28 + 1) {
                puVar1 = (ushort *)((long)*b_03 + lVar21);
                uVar105 = *puVar1;
                uVar112 = puVar1[1];
                uVar114 = puVar1[2];
                uVar116 = puVar1[3];
                uVar118 = puVar1[4];
                uVar120 = puVar1[5];
                uVar122 = puVar1[6];
                uVar124 = puVar1[7];
                auVar15._4_4_ = uVar33;
                auVar15._0_4_ = uVar33;
                auVar15._8_4_ = uVar33;
                auVar15._12_4_ = uVar33;
                auVar71 = psubsw(auVar109,auVar15);
                auVar16._4_4_ = uVar34;
                auVar16._0_4_ = uVar34;
                auVar16._8_4_ = uVar34;
                auVar16._12_4_ = uVar34;
                auVar35 = psubsw(auVar76,auVar16);
                sVar31 = auVar35._0_2_;
                sVar51 = auVar71._0_2_;
                auVar110._0_2_ = -(ushort)(sVar31 < sVar51);
                sVar32 = auVar35._2_2_;
                sVar52 = auVar71._2_2_;
                auVar110._2_2_ = -(ushort)(sVar32 < sVar52);
                sVar45 = auVar35._4_2_;
                sVar53 = auVar71._4_2_;
                auVar110._4_2_ = -(ushort)(sVar45 < sVar53);
                sVar46 = auVar35._6_2_;
                sVar54 = auVar71._6_2_;
                auVar110._6_2_ = -(ushort)(sVar46 < sVar54);
                sVar47 = auVar35._8_2_;
                sVar55 = auVar71._8_2_;
                auVar110._8_2_ = -(ushort)(sVar47 < sVar55);
                sVar48 = auVar35._10_2_;
                sVar56 = auVar71._10_2_;
                auVar110._10_2_ = -(ushort)(sVar48 < sVar56);
                sVar49 = auVar35._12_2_;
                sVar57 = auVar71._12_2_;
                sVar58 = auVar71._14_2_;
                auVar110._12_2_ = -(ushort)(sVar49 < sVar57);
                sVar50 = auVar35._14_2_;
                auVar110._14_2_ = -(ushort)(sVar50 < sVar58);
                local_198 = pblendvb(local_198,local_238,auVar110);
                local_98 = pblendvb(local_98,local_248,auVar110);
                uVar92 = (ushort)(sVar51 < sVar31) * sVar31 | (ushort)(sVar51 >= sVar31) * sVar51;
                uVar94 = (ushort)(sVar52 < sVar32) * sVar32 | (ushort)(sVar52 >= sVar32) * sVar52;
                uVar95 = (ushort)(sVar53 < sVar45) * sVar45 | (ushort)(sVar53 >= sVar45) * sVar53;
                uVar96 = (ushort)(sVar54 < sVar46) * sVar46 | (ushort)(sVar54 >= sVar46) * sVar54;
                uVar97 = (ushort)(sVar55 < sVar47) * sVar47 | (ushort)(sVar55 >= sVar47) * sVar55;
                uVar98 = (ushort)(sVar56 < sVar48) * sVar48 | (ushort)(sVar56 >= sVar48) * sVar56;
                uVar99 = (ushort)(sVar57 < sVar49) * sVar49 | (ushort)(sVar57 >= sVar49) * sVar57;
                uVar100 = (ushort)(sVar58 < sVar50) * sVar50 | (ushort)(sVar58 >= sVar50) * sVar58;
                auVar71 = pblendvb(local_a8,local_228,auVar110);
                psVar2 = (short *)((long)*b + lVar21);
                sVar31 = *psVar2;
                sVar32 = psVar2[1];
                sVar45 = psVar2[2];
                sVar46 = psVar2[3];
                sVar47 = psVar2[4];
                sVar48 = psVar2[5];
                sVar49 = psVar2[6];
                sVar50 = psVar2[7];
                uVar78 = (sVar31 < (short)uVar105) * uVar105 |
                         (ushort)(sVar31 >= (short)uVar105) * sVar31;
                uVar81 = (sVar32 < (short)uVar112) * uVar112 |
                         (ushort)(sVar32 >= (short)uVar112) * sVar32;
                uVar82 = (sVar45 < (short)uVar114) * uVar114 |
                         (ushort)(sVar45 >= (short)uVar114) * sVar45;
                uVar83 = (sVar46 < (short)uVar116) * uVar116 |
                         (ushort)(sVar46 >= (short)uVar116) * sVar46;
                uVar84 = (sVar47 < (short)uVar118) * uVar118 |
                         (ushort)(sVar47 >= (short)uVar118) * sVar47;
                uVar85 = (sVar48 < (short)uVar120) * uVar120 |
                         (ushort)(sVar48 >= (short)uVar120) * sVar48;
                uVar86 = (sVar49 < (short)uVar122) * uVar122 |
                         (ushort)(sVar49 >= (short)uVar122) * sVar49;
                uVar102 = (sVar50 < (short)uVar124) * uVar124 |
                          (ushort)(sVar50 >= (short)uVar124) * sVar50;
                uVar80 = ((short)uVar78 < (short)uVar92) * uVar92 |
                         ((short)uVar78 >= (short)uVar92) * uVar78;
                uVar78 = ((short)uVar81 < (short)uVar94) * uVar94 |
                         ((short)uVar81 >= (short)uVar94) * uVar81;
                uVar81 = ((short)uVar82 < (short)uVar95) * uVar95 |
                         ((short)uVar82 >= (short)uVar95) * uVar82;
                uVar82 = ((short)uVar83 < (short)uVar96) * uVar96 |
                         ((short)uVar83 >= (short)uVar96) * uVar83;
                uVar83 = ((short)uVar84 < (short)uVar97) * uVar97 |
                         ((short)uVar84 >= (short)uVar97) * uVar84;
                uVar84 = ((short)uVar85 < (short)uVar98) * uVar98 |
                         ((short)uVar85 >= (short)uVar98) * uVar85;
                uVar85 = ((short)uVar86 < (short)uVar99) * uVar99 |
                         ((short)uVar86 >= (short)uVar99) * uVar86;
                uVar86 = ((short)uVar102 < (short)uVar100) * uVar100 |
                         ((short)uVar102 >= (short)uVar100) * uVar102;
                auVar88 = pmovsxbw(auVar88,0x101010101010101);
                auVar103._0_2_ = -(ushort)((short)uVar80 < auVar88._0_2_);
                auVar103._2_2_ = -(ushort)((short)uVar78 < auVar88._2_2_);
                auVar103._4_2_ = -(ushort)((short)uVar81 < auVar88._4_2_);
                auVar103._6_2_ = -(ushort)((short)uVar82 < auVar88._6_2_);
                auVar103._8_2_ = -(ushort)((short)uVar83 < auVar88._8_2_);
                auVar103._10_2_ = -(ushort)((short)uVar84 < auVar88._10_2_);
                auVar103._12_2_ = -(ushort)((short)uVar85 < auVar88._12_2_);
                auVar103._14_2_ = -(ushort)((short)uVar86 < auVar88._14_2_);
                uVar80 = (-1 < (short)uVar80) * uVar80;
                uVar78 = (-1 < (short)uVar78) * uVar78;
                uVar81 = (-1 < (short)uVar81) * uVar81;
                uVar82 = (-1 < (short)uVar82) * uVar82;
                uVar83 = (-1 < (short)uVar83) * uVar83;
                uVar84 = (-1 < (short)uVar84) * uVar84;
                uVar85 = (-1 < (short)uVar85) * uVar85;
                uVar86 = (-1 < (short)uVar86) * uVar86;
                auVar62._0_2_ = -(ushort)(uVar105 == uVar80);
                auVar62._2_2_ = -(ushort)(uVar112 == uVar78);
                auVar62._4_2_ = -(ushort)(uVar114 == uVar81);
                auVar62._6_2_ = -(ushort)(uVar116 == uVar82);
                auVar62._8_2_ = -(ushort)(uVar118 == uVar83);
                auVar62._10_2_ = -(ushort)(uVar120 == uVar84);
                auVar62._12_2_ = -(ushort)(uVar122 == uVar85);
                auVar62._14_2_ = -(ushort)(uVar124 == uVar86);
                auVar77._0_2_ = -(ushort)(uVar80 == uVar92);
                auVar77._2_2_ = -(ushort)(uVar78 == uVar94);
                auVar77._4_2_ = -(ushort)(uVar81 == uVar95);
                auVar77._6_2_ = -(ushort)(uVar82 == uVar96);
                auVar77._8_2_ = -(ushort)(uVar83 == uVar97);
                auVar77._10_2_ = -(ushort)(uVar84 == uVar98);
                auVar77._12_2_ = -(ushort)(uVar85 == uVar99);
                auVar77._14_2_ = -(ushort)(uVar86 == uVar100);
                auVar35 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar21),local_198,auVar77);
                local_238 = pblendvb(auVar35,*(undefined1 (*) [16])((long)*b_04 + lVar21),auVar62);
                local_238 = ~auVar103 & local_238;
                auVar35 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar21),local_98,auVar77);
                local_248 = pblendvb(auVar35,*(undefined1 (*) [16])((long)*b_05 + lVar21),auVar62);
                local_a8 = paddsw(auVar71,auVar88);
                auVar35 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar21),local_a8,auVar77);
                local_228 = pblendvb(auVar35,*(undefined1 (*) [16])((long)*b_06 + lVar21),auVar62);
                local_248 = ~auVar103 & local_248;
                local_228 = ~auVar103 & local_228;
                uVar105 = ((short)local_128 < (short)uVar80) * uVar80 |
                          ((short)local_128 >= (short)uVar80) * local_128;
                uVar112 = ((short)uStack_126 < (short)uVar78) * uVar78 |
                          ((short)uStack_126 >= (short)uVar78) * uStack_126;
                uVar114 = ((short)uStack_124 < (short)uVar81) * uVar81 |
                          ((short)uStack_124 >= (short)uVar81) * uStack_124;
                uVar116 = ((short)uStack_122 < (short)uVar82) * uVar82 |
                          ((short)uStack_122 >= (short)uVar82) * uStack_122;
                uVar118 = ((short)uStack_120 < (short)uVar83) * uVar83 |
                          ((short)uStack_120 >= (short)uVar83) * uStack_120;
                uVar120 = ((short)uStack_11e < (short)uVar84) * uVar84 |
                          ((short)uStack_11e >= (short)uVar84) * uStack_11e;
                uVar122 = ((short)uStack_11c < (short)uVar85) * uVar85 |
                          ((short)uStack_11c >= (short)uVar85) * uStack_11c;
                uVar124 = ((short)uStack_11a < (short)uVar86) * uVar86 |
                          ((short)uStack_11a >= (short)uVar86) * uStack_11a;
                sVar31 = local_238._0_2_;
                uVar102 = (ushort)((short)uVar105 < sVar31) * sVar31 |
                          ((short)uVar105 >= sVar31) * uVar105;
                sVar31 = local_238._2_2_;
                uVar64 = (ushort)((short)uVar112 < sVar31) * sVar31 |
                         ((short)uVar112 >= sVar31) * uVar112;
                sVar31 = local_238._4_2_;
                uVar65 = (ushort)((short)uVar114 < sVar31) * sVar31 |
                         ((short)uVar114 >= sVar31) * uVar114;
                sVar31 = local_238._6_2_;
                uVar66 = (ushort)((short)uVar116 < sVar31) * sVar31 |
                         ((short)uVar116 >= sVar31) * uVar116;
                sVar31 = local_238._8_2_;
                uVar67 = (ushort)((short)uVar118 < sVar31) * sVar31 |
                         ((short)uVar118 >= sVar31) * uVar118;
                sVar31 = local_238._10_2_;
                uVar68 = (ushort)((short)uVar120 < sVar31) * sVar31 |
                         ((short)uVar120 >= sVar31) * uVar120;
                sVar31 = local_238._12_2_;
                uVar69 = (ushort)((short)uVar122 < sVar31) * sVar31 |
                         ((short)uVar122 >= sVar31) * uVar122;
                sVar31 = local_238._14_2_;
                uVar70 = (ushort)((short)uVar124 < sVar31) * sVar31 |
                         ((short)uVar124 >= sVar31) * uVar124;
                sVar31 = local_228._0_2_;
                sVar32 = local_248._0_2_;
                uVar105 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._2_2_;
                sVar32 = local_248._2_2_;
                uVar112 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._4_2_;
                sVar32 = local_248._4_2_;
                uVar114 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._6_2_;
                sVar32 = local_248._6_2_;
                uVar116 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._8_2_;
                sVar32 = local_248._8_2_;
                uVar118 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._10_2_;
                sVar32 = local_248._10_2_;
                uVar120 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._12_2_;
                sVar32 = local_248._12_2_;
                sVar45 = local_248._14_2_;
                uVar122 = (ushort)(sVar32 < sVar31) * sVar31 | (ushort)(sVar32 >= sVar31) * sVar32;
                sVar31 = local_228._14_2_;
                uVar124 = (ushort)(sVar45 < sVar31) * sVar31 | (ushort)(sVar45 >= sVar31) * sVar45;
                local_128 = ((short)uVar102 < (short)uVar105) * uVar105 |
                            ((short)uVar102 >= (short)uVar105) * uVar102;
                uStack_126 = ((short)uVar64 < (short)uVar112) * uVar112 |
                             ((short)uVar64 >= (short)uVar112) * uVar64;
                uStack_124 = ((short)uVar65 < (short)uVar114) * uVar114 |
                             ((short)uVar65 >= (short)uVar114) * uVar65;
                uStack_122 = ((short)uVar66 < (short)uVar116) * uVar116 |
                             ((short)uVar66 >= (short)uVar116) * uVar66;
                uStack_120 = ((short)uVar67 < (short)uVar118) * uVar118 |
                             ((short)uVar67 >= (short)uVar118) * uVar67;
                uStack_11e = ((short)uVar68 < (short)uVar120) * uVar120 |
                             ((short)uVar68 >= (short)uVar120) * uVar68;
                uStack_11c = ((short)uVar69 < (short)uVar122) * uVar122 |
                             ((short)uVar69 >= (short)uVar122) * uVar69;
                uStack_11a = ((short)uVar70 < (short)uVar124) * uVar124 |
                             ((short)uVar70 >= (short)uVar124) * uVar70;
                puVar1 = (ushort *)((long)*b_03 + lVar21);
                *puVar1 = uVar80;
                puVar1[1] = uVar78;
                puVar1[2] = uVar81;
                puVar1[3] = uVar82;
                puVar1[4] = uVar83;
                puVar1[5] = uVar84;
                puVar1[6] = uVar85;
                puVar1[7] = uVar86;
                *(undefined1 (*) [16])((long)*b_04 + lVar21) = local_238;
                *(undefined1 (*) [16])((long)*b_05 + lVar21) = local_248;
                *(undefined1 (*) [16])((long)*b_06 + lVar21) = local_228;
                bVar30 = (short)uVar80 < (short)local_138;
                uVar120 = (ushort)!bVar30 * (short)local_138;
                bVar7 = (short)uVar78 < local_138._2_2_;
                uVar105 = (ushort)!bVar7 * local_138._2_2_;
                bVar8 = (short)uVar81 < local_138._4_2_;
                uVar118 = (ushort)!bVar8 * local_138._4_2_;
                bVar9 = (short)uVar83 < (short)uStack_130;
                uVar116 = (ushort)!bVar9 * (short)uStack_130;
                bVar10 = (short)uVar84 < uStack_130._2_2_;
                uVar114 = (ushort)!bVar10 * uStack_130._2_2_;
                bVar11 = (short)uVar85 < uStack_130._4_2_;
                uVar112 = (ushort)!bVar11 * uStack_130._4_2_;
                local_138 = CONCAT26(((short)uVar82 < local_138._6_2_) * uVar82 |
                                     (ushort)((short)uVar82 >= local_138._6_2_) * local_138._6_2_,
                                     CONCAT24(bVar8 * uVar81 | uVar118,
                                              CONCAT22(bVar7 * uVar78 | uVar105,
                                                       bVar30 * uVar80 | uVar120)));
                uStack_130 = CONCAT26(((short)uVar86 < uStack_130._6_2_) * uVar86 |
                                      (ushort)((short)uVar86 >= uStack_130._6_2_) * uStack_130._6_2_
                                      ,CONCAT24(bVar11 * uVar85 | uVar112,
                                                CONCAT22(bVar10 * uVar84 | uVar114,
                                                         bVar9 * uVar83 | uVar116)));
                vH[0] = uVar28 & 0xffffffff;
                vH[1] = uVar25;
                arr_store_si128(*((ppVar20->field_4).trace)->trace_del_table,vH,t,s2Len,
                                (int32_t)in_R9,in_stack_fffffffffffffd68);
                vH_00[0] = uVar28 & 0xffffffff;
                vH_00[1] = uVar25;
                arr_store_si128(*(int **)((long)((ppVar20->field_4).trace)->trace_del_table + 8),
                                vH_00,t,s2Len,(int32_t)in_R9,in_stack_fffffffffffffd68);
                vH_01[0] = uVar28 & 0xffffffff;
                vH_01[1] = uVar25;
                arr_store_si128(*(int **)((long)((ppVar20->field_4).trace)->trace_del_table + 0x10),
                                vH_01,t,s2Len,(int32_t)in_R9,in_stack_fffffffffffffd68);
                vH_02[0] = uVar28 & 0xffffffff;
                vH_02[1] = uVar25;
                arr_store_si128(*(int **)((long)((ppVar20->field_4).trace)->trace_del_table + 0x18),
                                vH_02,t,s2Len,(int32_t)in_R9,in_stack_fffffffffffffd68);
                auVar109._2_2_ = uVar78;
                auVar109._0_2_ = uVar80;
                auVar109._4_2_ = uVar81;
                auVar109._6_2_ = uVar82;
                auVar109._8_2_ = uVar83;
                auVar109._10_2_ = uVar84;
                auVar109._12_2_ = uVar85;
                auVar109._14_2_ = uVar86;
                local_188 = ((short)local_188 < (short)uVar80) * uVar80 |
                            ((short)local_188 >= (short)uVar80) * local_188;
                uStack_186 = ((short)uStack_186 < (short)uVar78) * uVar78 |
                             ((short)uStack_186 >= (short)uVar78) * uStack_186;
                uStack_184 = ((short)uStack_184 < (short)uVar81) * uVar81 |
                             ((short)uStack_184 >= (short)uVar81) * uStack_184;
                uStack_182 = ((short)uStack_182 < (short)uVar82) * uVar82 |
                             ((short)uStack_182 >= (short)uVar82) * uStack_182;
                uStack_180 = ((short)uStack_180 < (short)uVar83) * uVar83 |
                             ((short)uStack_180 >= (short)uVar83) * uStack_180;
                uStack_17e = ((short)uStack_17e < (short)uVar84) * uVar84 |
                             ((short)uStack_17e >= (short)uVar84) * uStack_17e;
                uStack_17c = ((short)uStack_17c < (short)uVar85) * uVar85 |
                             ((short)uStack_17c >= (short)uVar85) * uStack_17c;
                uStack_17a = ((short)uStack_17a < (short)uVar86) * uVar86 |
                             ((short)uStack_17a >= (short)uVar86) * uStack_17a;
                lVar21 = lVar21 + 0x10;
                auVar76._2_2_ = uVar94;
                auVar76._0_2_ = uVar92;
                auVar76._4_2_ = uVar95;
                auVar76._6_2_ = uVar96;
                auVar76._8_2_ = uVar97;
                auVar76._10_2_ = uVar98;
                auVar76._12_2_ = uVar99;
                auVar76._14_2_ = uVar100;
              }
              auVar42._0_2_ = -(ushort)((short)local_b8 < (short)local_188);
              auVar42._2_2_ = -(ushort)(local_b8._2_2_ < (short)uStack_186);
              auVar42._4_2_ = -(ushort)((short)uStack_b4 < (short)uStack_184);
              auVar42._6_2_ = -(ushort)(uStack_b4._2_2_ < (short)uStack_182);
              auVar42._8_2_ = -(ushort)((short)uStack_b0 < (short)uStack_180);
              auVar42._10_2_ = -(ushort)(uStack_b0._2_2_ < (short)uStack_17e);
              auVar42._12_2_ = -(ushort)((short)uStack_ac < (short)uStack_17c);
              auVar42._14_2_ = -(ushort)(uStack_ac._2_2_ < (short)uStack_17a);
              if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar42 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42._14_2_ >> 7 & 1) != 0) || (auVar42._14_2_ & 0x8000) != 0) {
                uVar78 = ((short)uStack_180 < (short)local_188) * local_188 |
                         ((short)uStack_180 >= (short)local_188) * uStack_180;
                uVar80 = ((short)uStack_17e < (short)uStack_186) * uStack_186 |
                         ((short)uStack_17e >= (short)uStack_186) * uStack_17e;
                uVar81 = ((short)uStack_17c < (short)uStack_184) * uStack_184 |
                         ((short)uStack_17c >= (short)uStack_184) * uStack_17c;
                uVar82 = ((short)uStack_17a < (short)uStack_182) * uStack_182 |
                         ((short)uStack_17a >= (short)uStack_182) * uStack_17a;
                sVar31 = (0 < (short)uStack_180) * uStack_180;
                sVar32 = (0 < (short)uStack_17e) * uStack_17e;
                sVar45 = (0 < (short)uStack_17c) * uStack_17c;
                sVar46 = (0 < (short)uStack_17a) * uStack_17a;
                uVar78 = ((short)uVar81 < (short)uVar78) * uVar78 |
                         ((short)uVar81 >= (short)uVar78) * uVar81;
                uVar80 = ((short)uVar82 < (short)uVar80) * uVar80 |
                         ((short)uVar82 >= (short)uVar80) * uVar82;
                uVar81 = (sVar31 < (short)uVar81) * uVar81 |
                         (ushort)(sVar31 >= (short)uVar81) * sVar31;
                uVar82 = (sVar32 < (short)uVar82) * uVar82 |
                         (ushort)(sVar32 >= (short)uVar82) * sVar32;
                uVar83 = (ushort)(sVar45 < sVar31) * sVar31 | (ushort)(sVar45 >= sVar31) * sVar45;
                uVar84 = (ushort)(sVar46 < sVar32) * sVar32 | (ushort)(sVar46 >= sVar32) * sVar46;
                sVar45 = (ushort)(0 < sVar45) * sVar45;
                sVar46 = (ushort)(0 < sVar46) * sVar46;
                auVar43._0_4_ =
                     CONCAT22(((short)uVar81 < (short)uVar80) * uVar80 |
                              ((short)uVar81 >= (short)uVar80) * uVar81,
                              ((short)uVar80 < (short)uVar78) * uVar78 |
                              ((short)uVar80 >= (short)uVar78) * uVar80);
                auVar43._4_2_ =
                     ((short)uVar82 < (short)uVar81) * uVar81 |
                     ((short)uVar82 >= (short)uVar81) * uVar82;
                auVar43._6_2_ =
                     ((short)uVar83 < (short)uVar82) * uVar82 |
                     ((short)uVar83 >= (short)uVar82) * uVar83;
                auVar43._8_2_ =
                     ((short)uVar84 < (short)uVar83) * uVar83 |
                     ((short)uVar84 >= (short)uVar83) * uVar84;
                auVar43._10_2_ =
                     (sVar45 < (short)uVar84) * uVar84 | (ushort)(sVar45 >= (short)uVar84) * sVar45;
                auVar43._12_2_ =
                     (ushort)(sVar46 < sVar45) * sVar45 | (ushort)(sVar46 >= sVar45) * sVar46;
                auVar43._14_2_ = (ushort)(0 < sVar46) * sVar46;
                auVar35 = pshuflw(auVar43,auVar43,0);
                local_b8 = auVar35._0_4_;
                memcpy(ptr,b_03,__n);
                memcpy(ptr_00,b_04,__n);
                memcpy(ptr_01,b_05,__n);
                memcpy(ptr_02,b_06,__n);
                local_290 = auVar43._0_4_;
                local_24c = t;
                uStack_b4 = local_b8;
                uStack_b0 = local_b8;
                uStack_ac = local_b8;
              }
              local_178 = auVar90;
              local_168 = auVar74;
              local_158 = auVar126;
            }
            uVar25 = 0;
            sVar31 = 0;
            sVar32 = 0;
            sVar45 = 0;
            while( true ) {
              if ((uVar27 & 0xfffffff) << 3 == (uint)uVar25) break;
              uVar29 = local_260;
              if ((*(short *)((long)*ptr + uVar25 * 2) == (short)local_290) &&
                 (uVar22 = ((uint)uVar25 & 7) * uVar27 + ((uint)(uVar25 >> 3) & 0x1fffffff),
                 (int)uVar22 < (int)local_260)) {
                sVar31 = *(short *)((long)*ptr_00 + uVar25 * 2);
                sVar32 = *(short *)((long)*ptr_01 + uVar25 * 2);
                sVar45 = *(short *)((long)*ptr_02 + uVar25 * 2);
                uVar29 = (ulong)uVar22;
              }
              local_260 = uVar29;
              uVar25 = uVar25 + 1;
            }
            auVar44._0_2_ = -(ushort)((short)local_138 < (short)local_1a8);
            auVar44._2_2_ = -(ushort)(local_138._2_2_ < (short)uStack_1a6);
            auVar44._4_2_ = -(ushort)(local_138._4_2_ < (short)local_1a8);
            auVar44._6_2_ = -(ushort)(local_138._6_2_ < (short)uStack_1a6);
            auVar44._8_2_ = -(ushort)((short)uStack_130 < (short)local_1a8);
            auVar44._10_2_ = -(ushort)(uStack_130._2_2_ < (short)uStack_1a6);
            auVar44._12_2_ = -(ushort)(uStack_130._4_2_ < (short)local_1a8);
            auVar44._14_2_ = -(ushort)(uStack_130._6_2_ < (short)uStack_1a6);
            auVar63._0_2_ = -(ushort)(local_c8 < (short)local_128);
            auVar63._2_2_ = -(ushort)(sStack_c6 < (short)uStack_126);
            auVar63._4_2_ = -(ushort)(local_c8 < (short)uStack_124);
            auVar63._6_2_ = -(ushort)(sStack_c6 < (short)uStack_122);
            auVar63._8_2_ = -(ushort)(local_c8 < (short)uStack_120);
            auVar63._10_2_ = -(ushort)(sStack_c6 < (short)uStack_11e);
            auVar63._12_2_ = -(ushort)(local_c8 < (short)uStack_11c);
            auVar63._14_2_ = -(ushort)(sStack_c6 < (short)uStack_11a);
            auVar63 = auVar63 | auVar44;
            if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar63 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
              local_290._0_2_ = 0;
              sVar31 = 0;
              sVar32 = 0;
              sVar45 = 0;
              local_24c = 0;
              local_260._0_4_ = 0;
            }
            ppVar20->score = (int)(short)local_290;
            ppVar20->end_query = (int)local_260;
            ppVar20->end_ref = local_24c;
            *(int *)(ppVar20->field_4).extra = (int)sVar31;
            ((ppVar20->field_4).stats)->similar = (int)sVar32;
            ((ppVar20->field_4).stats)->length = (int)sVar45;
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar20;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_table_scan_profile_sse41_128_16",pcVar23);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            vH = _mm_max_epi16(vH, vZero);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            case0 = _mm_cmpeq_epi16(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}